

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall
p2t::Sweep::FillLeftConcaveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Point *pPVar1;
  Point *pPVar2;
  double dVar3;
  Node *node_00;
  double dVar4;
  
  node_00 = node->prev;
  while( true ) {
    Fill(this,tcx,node_00);
    node_00 = node->prev;
    pPVar1 = node_00->point;
    pPVar2 = edge->p;
    if (pPVar1 == pPVar2) {
      return;
    }
    dVar4 = (pPVar1->y - pPVar2->y) * (edge->q->x - pPVar2->x) -
            (pPVar1->x - pPVar2->x) * (edge->q->y - pPVar2->y);
    if (ABS(dVar4) < 1e-12) {
      return;
    }
    if (0.0 < dVar4) {
      return;
    }
    pPVar2 = node_00->prev->point;
    dVar4 = pPVar2->x;
    dVar3 = pPVar2->y;
    dVar4 = (pPVar1->y - dVar3) * (node->point->x - dVar4) -
            (pPVar1->x - dVar4) * (node->point->y - dVar3);
    if (ABS(dVar4) < 1e-12) break;
    if (0.0 < dVar4) {
      return;
    }
  }
  return;
}

Assistant:

void Sweep::FillLeftConcaveEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  Fill(tcx, *node.prev);
  if (node.prev->point != edge->p) {
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.prev->point, *edge->p) == CW) {
      // Below
      if (Orient2d(*node.point, *node.prev->point, *node.prev->prev->point) == CW) {
        // Next is concave
        FillLeftConcaveEdgeEvent(tcx, edge, node);
      } else{
        // Next is convex
      }
    }
  }

}